

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O1

int wrapped_printf(char *format,...)

{
  int *piVar1;
  char in_AL;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  curious_file_record_t *pcVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  curious_write_record_t io_args;
  undefined8 local_118;
  void **local_110;
  undefined1 *local_108;
  ulong local_100;
  undefined4 local_f8;
  char *local_f0;
  char *local_e8;
  undefined4 local_e0;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  lVar3 = __tls_get_addr(&PTR_0027c768);
  piVar1 = (int *)(lVar3 + 0xc);
  *piVar1 = *piVar1 + 1;
  pcVar4 = (code *)gotcha_get_wrappee(io_fns[0x1d].handle);
  local_110 = &args[0].overflow_arg_area;
  local_118 = 0x3000000008;
  local_108 = local_d8;
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    pcVar5 = get_curious_file_record(1);
    if (pcVar5 == (curious_file_record_t *)0x0) {
      local_e8 = (char *)0x0;
      local_f0 = (char *)0x0;
    }
    else {
      local_f0 = pcVar5->filesystem;
      local_e8 = pcVar5->mount_point;
    }
    local_100 = 0;
    local_f8 = 0;
    local_e0 = 0x1b;
    curious_call_callbacks(2,&local_100);
    uVar2 = (*pcVar4)(format,&local_118);
    local_f8 = 1;
    if (0 < (int)uVar2) {
      local_100 = (ulong)uVar2;
    }
    curious_call_callbacks(3,&local_100);
    *piVar1 = *piVar1 + -1;
  }
  else {
    *piVar1 = *piVar1 + -1;
    uVar2 = (*pcVar4)(format,&local_118);
  }
  return uVar2;
}

Assistant:

int wrapped_printf(const char* format, ...)
{
    WRAPPER_ENTER(printf);

    // Get the handle for the original function
    vprintf_f orig_vprintf = (vprintf_f) gotcha_get_wrappee(io_fns[CURIOUS_VPRINTF_ID].handle);

    // Get the variable-length argument list set up
    va_list args;
    va_start(args, format);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(STDOUT_FILENO);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_PRINTF_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_vprintf(format, args);
        io_args.call_count = 1;
        if (return_val > 0) {
            io_args.bytes_written = return_val;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, printf);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_vprintf(format, args), printf);
    }
}